

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.h
# Opt level: O3

void __thiscall merlin::ijgp::ijgp(ijgp *this,graphical_model *gm)

{
  _Rb_tree_header *p_Var1;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  graphical_model::graphical_model(&this->super_graphical_model,gm);
  (this->super_algorithm).m_stop_msg = 0.0;
  (this->super_algorithm).m_start_time = 0.0;
  (this->super_algorithm).m_stop_iter = 0.0;
  (this->super_algorithm).m_stop_obj = 0.0;
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__ijgp_00190d90;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&PTR__ijgp_00190e28;
  graphical_model::graphical_model(&this->m_gmo,gm);
  this->m_task = PR;
  this->m_elim_op = Max;
  (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_parents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_parents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_parents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_best_config).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_best_config).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_best_config).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&this->m_clusters,0,0x90);
  my_set<unsigned_long>::my_set(&this->m_roots,10);
  p_Var1 = &(this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header;
  (this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_forward).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_forward).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_forward).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_backward).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_backward).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_backward).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_schedule).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_schedule).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_schedule).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_edge_indeces).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_edge_indeces).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_edge_indeces).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  graphical_model::clear_factors(&this->super_graphical_model);
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  (*(this->super_graphical_model)._vptr_graphical_model[0xf])(this,&local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

ijgp(const graphical_model& gm) : graphical_model(gm), m_gmo(gm) {
		clear_factors();
		set_properties();
	}